

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t process_global_set(archive_read *a,mtree_option **global,char *line)

{
  wchar_t wVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  size_t sStack_40;
  wchar_t r;
  size_t len;
  char *eq;
  char *next;
  char *line_local;
  mtree_option **global_local;
  archive_read *a_local;
  
  next = line + 4;
  do {
    sVar2 = strspn(next," \t\r\n");
    __s = next + sVar2;
    if (*__s == '\0') {
      return L'\0';
    }
    sVar2 = strcspn(__s," \t\r\n");
    next = __s + sVar2;
    pcVar3 = strchr(__s,0x3d);
    if (next < pcVar3) {
      sStack_40 = (long)next - (long)__s;
    }
    else {
      sStack_40 = (long)pcVar3 - (long)__s;
    }
    remove_option(global,__s,sStack_40);
    wVar1 = add_option(a,global,__s,(long)next - (long)__s);
  } while (wVar1 == L'\0');
  return wVar1;
}

Assistant:

static int
process_global_set(struct archive_read *a,
    struct mtree_option **global, const char *line)
{
	const char *next, *eq;
	size_t len;
	int r;

	line += 4;
	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		line = next;
		next = line + strcspn(line, " \t\r\n");
		eq = strchr(line, '=');
		if (eq > next)
			len = next - line;
		else
			len = eq - line;

		remove_option(global, line, len);
		r = add_option(a, global, line, next - line);
		if (r != ARCHIVE_OK)
			return (r);
		line = next;
	}
}